

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O1

void __thiscall quantum::QuantumComputer::viewProbabilityForBaseVector(QuantumComputer *this)

{
  double *pdVar1;
  double *pdVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nVector with probability {",0x1a);
  pdVar1 = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    printf("[%.4f]",*pdVar2 * *pdVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
  return;
}

Assistant:

void quantum::QuantumComputer::viewProbabilityForBaseVector(){
    std::cout << "\nVector with probability {";
    for (auto x: this->baseVector) {
        printf("[%.4f]", pow(fabs(x), 2));
    }
    std::cout << "}\n";
}